

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RngStream.cpp
# Opt level: O0

void anon_unknown.dwarf_69cc::MatVecModM(double (*A) [3],double *s,double *v,double m)

{
  long in_RDX;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double x [3];
  int i;
  double adStack_48 [4];
  int local_24;
  double local_20;
  long local_18;
  double *local_10;
  long local_8;
  
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    dVar1 = MultModM(*(double *)(local_8 + (long)local_24 * 0x18),*local_10,0.0,local_20);
    adStack_48[local_24] = dVar1;
    dVar1 = MultModM(*(double *)(local_8 + (long)local_24 * 0x18 + 8),local_10[1],
                     adStack_48[local_24],local_20);
    adStack_48[local_24] = dVar1;
    dVar1 = MultModM(*(double *)(local_8 + (long)local_24 * 0x18 + 0x10),local_10[2],
                     adStack_48[local_24],local_20);
    adStack_48[local_24] = dVar1;
  }
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    *(double *)(local_18 + (long)local_24 * 8) = adStack_48[local_24];
  }
  return;
}

Assistant:

void MatVecModM (const double A[3][3], const double s[3], double v[3],
                 double m)
{
    int i;
    double x[3];               // Necessary if v = s

    for (i = 0; i < 3; ++i) {
        x[i] = MultModM (A[i][0], s[0], 0.0, m);
        x[i] = MultModM (A[i][1], s[1], x[i], m);
        x[i] = MultModM (A[i][2], s[2], x[i], m);
    }
    for (i = 0; i < 3; ++i)
        v[i] = x[i];
}